

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles2::Functional::eval_refract_float(ShaderEvalContext *c)

{
  float fVar1;
  
  fVar1 = tcu::refract(c->in[0].m_data[2],c->in[1].m_data[0],c->in[2].m_data[1]);
  (c->color).m_data[0] = fVar1;
  return;
}

Assistant:

void eval_refract_float	(ShaderEvalContext& c) { c.color.x()	= refract(c.in[0].z(),                 c.in[1].x(),                 c.in[2].y()); }